

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int new_capacity;
  ImGuiWindow **ppIVar5;
  
  ppIVar5 = this->Data;
  lVar4 = (long)it - (long)ppIVar5;
  iVar2 = this->Size;
  if (iVar2 == this->Capacity) {
    if (iVar2 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar2 / 2 + iVar2;
    }
    new_capacity = iVar2 + 1;
    if (iVar2 + 1 < iVar1) {
      new_capacity = iVar1;
    }
    reserve(this,new_capacity);
    iVar2 = this->Size;
    ppIVar5 = this->Data;
  }
  lVar3 = (long)iVar2 - (lVar4 >> 3);
  if (lVar3 != 0 && lVar4 >> 3 <= (long)iVar2) {
    memmove((void *)((long)ppIVar5 + lVar4 + 8),(void *)((long)ppIVar5 + lVar4),lVar3 * 8);
    ppIVar5 = this->Data;
  }
  *(ImGuiWindow **)((long)ppIVar5 + lVar4) = *v;
  this->Size = this->Size + 1;
  return (ImGuiWindow **)(lVar4 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }